

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
find<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long_const&>
          (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                 table,unsigned_long *params)

{
  unsigned_long uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  uint hash;
  Entry *pEVar6;
  uint uVar7;
  unsigned_long *in_R8;
  uint *puVar8;
  Maybe<unsigned_long> MVar9;
  
  pEVar6 = table.ptr;
  aVar5.value = table.size_;
  if (*(long *)&pEVar6[1].value != 0) {
    hash = (uint)((int)(*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar2 = kj::_::chooseBucket(hash,(uint)*(long *)&pEVar6[1].value);
    uVar1 = pEVar6[1].key;
    uVar3 = (ulong)uVar2;
    uVar7 = *(uint *)(uVar1 + 4 + uVar3 * 8);
    aVar5 = extraout_RDX;
    if (uVar7 != 0) {
      puVar8 = (uint *)(uVar1 + uVar3 * 8);
      aVar5.value = *in_R8;
      do {
        if (((uVar7 != 1) && (*puVar8 == hash)) &&
           (*(unsigned_long *)(table.size_ + (ulong)(uVar7 - 2) * 0x10) == aVar5.value)) {
          *this = (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar7 - 2);
          goto LAB_003f4aaf;
        }
        uVar4 = uVar3 + 1;
        uVar3 = uVar4 & 0xffffffff;
        if (uVar4 == *(ulong *)&pEVar6[1].value) {
          uVar3 = 0;
        }
        puVar8 = (uint *)(uVar1 + uVar3 * 8);
        uVar7 = puVar8[1];
      } while (uVar7 != 0);
    }
  }
  *this = (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>)
          0x0;
LAB_003f4aaf:
  MVar9.ptr.field_1.value = aVar5.value;
  MVar9.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar9.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }